

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void rw::RawMatrix::mult(RawMatrix *dst,RawMatrix *src1,RawMatrix *src2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  fVar1 = (float)(src1->right).y;
  fVar2 = (float)(src2->up).x;
  fVar3 = (float)(src2->at).x;
  fVar4 = (float)(src1->right).z;
  fVar5 = (float)src1->rightw;
  fVar6 = (float)(src2->pos).x;
  (dst->right).x =
       (float32)(fVar5 * fVar6 +
                fVar4 * fVar3 + (float)(src1->right).x * (float)(src2->right).x + fVar1 * fVar2);
  fVar7 = (float)(src1->right).x;
  fVar8 = (float)(src2->up).y;
  fVar9 = (float)(src2->at).y;
  fVar10 = (float)(src2->pos).y;
  (dst->right).y =
       (float32)(fVar5 * fVar10 + fVar4 * fVar9 + (float)(src2->right).y * fVar7 + fVar1 * fVar8);
  fVar1 = (float)(src1->right).y;
  fVar11 = (float)(src2->up).z;
  fVar12 = (float)(src2->at).z;
  fVar13 = (float)(src2->pos).z;
  (dst->right).z =
       (float32)(fVar5 * fVar13 + fVar4 * fVar12 + (float)(src2->right).z * fVar7 + fVar1 * fVar11);
  fVar4 = (float)(src1->up).y;
  fVar14 = (float)(src1->up).z;
  fVar15 = (float)src2->upw;
  fVar16 = (float)(src2->right).x;
  fVar17 = (float)(src1->up).x;
  fVar18 = (float)src2->atw;
  fVar19 = (float)src2->posw;
  fVar20 = (float)src1->upw;
  dst->rightw = (float32)(fVar5 * fVar19 +
                         (float)(src1->right).z * fVar18 +
                         (float)src2->rightw * fVar7 + fVar1 * fVar15);
  (dst->up).x = (float32)(fVar20 * fVar6 + fVar14 * fVar3 + fVar16 * fVar17 + fVar4 * fVar2);
  fVar1 = (float)(src1->up).x;
  fVar2 = (float)(src2->right).y;
  (dst->up).y = (float32)(fVar20 * fVar10 + fVar14 * fVar9 + fVar1 * fVar2 + fVar8 * fVar4);
  fVar4 = (float)(src1->up).y;
  fVar5 = (float)(src2->right).z;
  (dst->up).z = (float32)(fVar20 * fVar13 + fVar14 * fVar12 + fVar1 * fVar5 + fVar11 * fVar4);
  fVar7 = (float)(src1->at).y;
  fVar8 = (float)(src2->up).x;
  fVar11 = (float)(src1->at).x;
  fVar14 = (float)src2->rightw;
  fVar17 = (float)(src1->at).z;
  fVar21 = (float)src1->atw;
  dst->upw = (float32)(fVar20 * fVar19 +
                      (float)(src1->up).z * fVar18 + fVar1 * fVar14 + fVar15 * fVar4);
  (dst->at).x = (float32)(fVar21 * fVar6 + fVar17 * fVar3 + fVar11 * fVar16 + fVar8 * fVar7);
  fVar1 = (float)(src2->up).y;
  fVar3 = (float)(src1->at).x;
  (dst->at).y = (float32)(fVar21 * fVar10 + fVar9 * fVar17 + fVar3 * fVar2 + fVar7 * fVar1);
  fVar4 = (float)(src1->at).y;
  fVar7 = (float)(src2->up).z;
  (dst->at).z = (float32)(fVar21 * fVar13 + fVar17 * fVar12 + fVar3 * fVar5 + fVar4 * fVar7);
  fVar9 = (float)src2->upw;
  fVar11 = (float)(src1->pos).y;
  fVar12 = (float)(src1->pos).x;
  fVar15 = (float)(src1->pos).z;
  fVar17 = (float)(src2->at).x;
  fVar20 = (float)src1->posw;
  dst->atw = (float32)(fVar21 * fVar19 +
                      fVar18 * (float)(src1->at).z + fVar3 * fVar14 + fVar4 * fVar9);
  (dst->pos).x = (float32)(fVar20 * fVar6 + fVar17 * fVar15 + fVar12 * fVar16 + fVar11 * fVar8);
  fVar3 = (float)(src1->pos).x;
  (dst->pos).y = (float32)(fVar10 * fVar20 +
                          (float)(src2->at).y * fVar15 + fVar2 * fVar3 + fVar1 * fVar11);
  fVar1 = (float)(src1->pos).y;
  (dst->pos).z = (float32)(fVar13 * fVar20 +
                          fVar15 * (float)(src2->at).z + fVar5 * fVar3 + fVar7 * fVar1);
  dst->posw = (float32)(fVar20 * fVar19 +
                       (float)(src1->pos).z * (float)src2->atw + fVar3 * fVar14 + fVar9 * fVar1);
  return;
}

Assistant:

void
RawMatrix::mult(RawMatrix *dst, RawMatrix *src1, RawMatrix *src2)
{
	dst->right.x = src1->right.x*src2->right.x + src1->right.y*src2->up.x + src1->right.z*src2->at.x + src1->rightw*src2->pos.x;
	dst->right.y = src1->right.x*src2->right.y + src1->right.y*src2->up.y + src1->right.z*src2->at.y + src1->rightw*src2->pos.y;
	dst->right.z = src1->right.x*src2->right.z + src1->right.y*src2->up.z + src1->right.z*src2->at.z + src1->rightw*src2->pos.z;
	dst->rightw  = src1->right.x*src2->rightw  + src1->right.y*src2->upw  + src1->right.z*src2->atw  + src1->rightw*src2->posw;
	dst->up.x    = src1->up.x*src2->right.x    + src1->up.y*src2->up.x    + src1->up.z*src2->at.x + src1->upw*src2->pos.x;
	dst->up.y    = src1->up.x*src2->right.y    + src1->up.y*src2->up.y    + src1->up.z*src2->at.y + src1->upw*src2->pos.y;
	dst->up.z    = src1->up.x*src2->right.z    + src1->up.y*src2->up.z    + src1->up.z*src2->at.z + src1->upw*src2->pos.z;
	dst->upw     = src1->up.x*src2->rightw     + src1->up.y*src2->upw     + src1->up.z*src2->atw  + src1->upw*src2->posw;
	dst->at.x    = src1->at.x*src2->right.x    + src1->at.y*src2->up.x    + src1->at.z*src2->at.x + src1->atw*src2->pos.x;
	dst->at.y    = src1->at.x*src2->right.y    + src1->at.y*src2->up.y    + src1->at.z*src2->at.y + src1->atw*src2->pos.y;
	dst->at.z    = src1->at.x*src2->right.z    + src1->at.y*src2->up.z    + src1->at.z*src2->at.z + src1->atw*src2->pos.z;
	dst->atw     = src1->at.x*src2->rightw     + src1->at.y*src2->upw     + src1->at.z*src2->atw  + src1->atw*src2->posw;
	dst->pos.x   = src1->pos.x*src2->right.x   + src1->pos.y*src2->up.x   + src1->pos.z*src2->at.x + src1->posw*src2->pos.x;
	dst->pos.y   = src1->pos.x*src2->right.y   + src1->pos.y*src2->up.y   + src1->pos.z*src2->at.y + src1->posw*src2->pos.y;
	dst->pos.z   = src1->pos.x*src2->right.z   + src1->pos.y*src2->up.z   + src1->pos.z*src2->at.z + src1->posw*src2->pos.z;
	dst->posw    = src1->pos.x*src2->rightw    + src1->pos.y*src2->upw    + src1->pos.z*src2->atw  + src1->posw*src2->posw;
}